

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

int __thiscall TSMuxer::close(TSMuxer *this,int __fd)

{
  AbstractOutputStream *pAVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int extraout_var;
  undefined8 uVar5;
  TSMuxer *pTVar6;
  undefined4 in_register_00000034;
  bool bVar7;
  bool bRes;
  TSMuxer *this_local;
  
  pTVar6 = this;
  if ((this->m_isExternalFile & 1U) == 0) {
    if ((this->super_AbstractMuxer).m_sectorSize != 0) {
      bVar7 = false;
      if (this->m_outBufLen == 0) {
        iVar3 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[4])
                          (this->m_muxFile,CONCAT44(in_register_00000034,__fd));
        auVar2._4_4_ = extraout_var;
        auVar2._0_4_ = iVar3;
        auVar2._8_8_ = (long)extraout_var >> 0x1f;
        bVar7 = SUB168(auVar2 % SEXT816((long)(this->super_AbstractMuxer).m_sectorSize),0) == 0;
      }
      if (!bVar7) {
        __assert_fail("m_outBufLen == 0 && m_muxFile->size() % m_sectorSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x1d7,"virtual bool TSMuxer::close()");
      }
    }
    uVar4 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = 0;
      pTVar6 = (TSMuxer *)(ulong)uVar4;
    }
    else if ((this->super_AbstractMuxer).m_sectorSize == 0) {
      if (0 < this->m_outBufLen) {
        pAVar1 = this->m_muxFile;
        uVar5 = std::__cxx11::string::c_str();
        uVar4 = (*(pAVar1->super_AbstractStream)._vptr_AbstractStream[2])(pAVar1,uVar5,6,0);
        pTVar6 = (TSMuxer *)(ulong)uVar4;
        if ((uVar4 & 1) == 0) {
          this_local._7_1_ = 0;
          goto LAB_0034e58f;
        }
        uVar4 = writeOutFile(this,this->m_outBuf,this->m_outBufLen);
        pTVar6 = (TSMuxer *)(ulong)uVar4;
        if (uVar4 == 0) {
          this_local._7_1_ = 0;
          goto LAB_0034e58f;
        }
      }
      uVar4 = (*(this->m_muxFile->super_AbstractStream)._vptr_AbstractStream[3])();
      pTVar6 = (TSMuxer *)((ulong)uVar4 & 0xffffffffffffff01);
      this_local._7_1_ = SUB81(pTVar6,0);
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_0034e58f:
  return (int)CONCAT71((int7)((ulong)pTVar6 >> 8),this_local._7_1_);
}

Assistant:

bool TSMuxer::close()
{
    if (m_isExternalFile)
        return true;

    if (m_sectorSize)
    {
        assert(m_outBufLen == 0 && m_muxFile->size() % m_sectorSize == 0);
    }

    if (!m_muxFile->close())
        return false;

    if (m_sectorSize)
        return true;

    if (m_outBufLen > 0)
    {
        if (!m_muxFile->open(m_outFileName.c_str(), AbstractOutputStream::ofWrite + AbstractOutputStream::ofAppend))
            return false;
        if (!writeOutFile(m_outBuf, m_outBufLen))
            return false;
    }
    const bool bRes = m_muxFile->close();
    return bRes;
}